

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_dither.c
# Opt level: O3

float PaUtil_GenerateFloatTriangularDither(PaUtilTriangularDitherGenerator *state)

{
  PaUint32 PVar1;
  PaUint32 PVar2;
  
  PVar1 = state->randSeed1 * 0xbb38435 + 0x3619636b;
  state->randSeed1 = PVar1;
  PVar2 = state->randSeed2 * 0xbb38435 + 0x3619636b;
  state->randSeed2 = PVar2;
  PVar2 = ((int)PVar2 >> 0x12) + ((int)PVar1 >> 0x12);
  PVar1 = state->previous;
  state->previous = PVar2;
  return (float)(int)(PVar2 - PVar1) * 3.051851e-05;
}

Assistant:

float PaUtil_GenerateFloatTriangularDither( PaUtilTriangularDitherGenerator *state )
{
    PaInt32 current, highPass;

    /* Generate two random numbers. */
    state->randSeed1 = (state->randSeed1 * 196314165) + 907633515;
    state->randSeed2 = (state->randSeed2 * 196314165) + 907633515;

    /* Generate triangular distribution about 0.
     * Shift before adding to prevent overflow which would skew the distribution.
     * Also shift an extra bit for the high pass filter.
     */
    current = (((PaInt32)state->randSeed1)>>DITHER_SHIFT_) +
              (((PaInt32)state->randSeed2)>>DITHER_SHIFT_);

    /* High pass filter to reduce audibility. */
    highPass = current - state->previous;
    state->previous = current;
    return ((float)highPass) * const_float_dither_scale_;
}